

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O0

Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::getNextEvent_abi_cxx11_
          (Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  int iVar1;
  YamlEvent local_110;
  _func_void_yaml_event_s_ptr *local_e8;
  undefined1 local_e0 [8];
  YamlEventPtr event_holder;
  string local_c0;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_80 [8];
  yaml_event_t event;
  ParserContext *this_local;
  
  event.end_mark.column = (size_t)this;
  iVar1 = yaml_parser_parse(&this->parser_,(yaml_event_t *)local_80);
  if (iVar1 == 0) {
    format_abi_cxx11_(&local_c0,"Error parsing yaml %d@%d: %s",
                      (ulong)(uint)(this->parser_).problem_mark.line,
                      (ulong)(uint)(this->parser_).problem_mark.column,(this->parser_).problem);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_a0,&local_c0);
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_a0);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    local_e8 = yaml_event_delete;
    std::unique_ptr<yaml_event_s,void(*)(yaml_event_s*)>::unique_ptr<void(*)(yaml_event_s*),void>
              ((unique_ptr<yaml_event_s,void(*)(yaml_event_s*)> *)local_e0,(pointer)local_80,
               &local_e8);
    YamlEvent::YamlEvent(&local_110,(pointer)local_80);
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_110);
    YamlEvent::~YamlEvent(&local_110);
    std::unique_ptr<yaml_event_s,_void_(*)(yaml_event_s_*)>::~unique_ptr
              ((unique_ptr<yaml_event_s,_void_(*)(yaml_event_s_*)> *)local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<YamlEvent, std::string> getNextEvent() {
		yaml_event_t event;
		if (!yaml_parser_parse(&parser_, &event)) {
			return Unexpected(format("Error parsing yaml %d@%d: %s",
				(int)parser_.problem_mark.line, (int)parser_.problem_mark.column,
				parser_.problem));
		}
		using YamlEventPtr = std::unique_ptr<yaml_event_t, decltype(&yaml_event_delete)>;
		const auto event_holder = YamlEventPtr(&event, &yaml_event_delete);

		return YamlEvent(event);
	}